

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msgpuck.cc
# Opt level: O2

void test_read_num<long,int,int(*)(char_const**,long*)>
               (int num1,_func_int_char_ptr_ptr_long_ptr *read_f,bool is_ok)

{
  byte bVar1;
  mp_type mVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  uint64_t uVar6;
  ulong uVar7;
  char *pcVar8;
  undefined8 uVar9;
  long lVar10;
  uint64_t val;
  float fVar11;
  double dVar12;
  char *mp_num_pos1;
  float local_254;
  long num2;
  char *mp_num_pos2;
  double local_240;
  char mp_nums [16] [16];
  char str [256];
  undefined1 local_38 [8];
  
  builtin_strncpy(str,"typed read of ",0xf);
  val = (uint64_t)num1;
  if (num1 < 0) {
    pcVar8 = "%lld";
    uVar7 = val;
  }
  else {
    pcVar8 = "%llu";
    uVar7 = (ulong)(uint)num1;
  }
  iVar4 = snprintf(str + 0xe,0xf2,pcVar8,uVar7);
  pcVar8 = str + 0xe + iVar4;
  iVar4 = snprintf(pcVar8,(size_t)(local_38 + -(long)pcVar8)," into ");
  snprintf(pcVar8 + iVar4,(size_t)(local_38 + -(long)(pcVar8 + iVar4)),"int%zu_t",0x40);
  _space((FILE *)_stdout);
  fwrite("# ",2,1,_stdout);
  fputs(str,_stdout);
  fputc(10,_stdout);
  iVar4 = 0;
  if (-1 < num1) {
    iVar4 = test_encode_uint_all_sizes(mp_nums,(ulong)(uint)num1);
  }
  iVar5 = test_encode_int_all_sizes(mp_nums + iVar4,val);
  local_254 = (float)num1;
  local_240 = (double)num1;
  uVar3 = iVar4 + iVar5;
  if (iVar4 + iVar5 < 1) {
    uVar3 = 0;
  }
  lVar10 = 0;
  do {
    if ((ulong)uVar3 * 0x10 == lVar10) {
      return;
    }
    pcVar8 = mp_nums[0] + lVar10;
    bVar1 = *pcVar8;
    mVar2 = mp_type_hint[bVar1];
    mp_num_pos1 = pcVar8;
    if (mVar2 == MP_UINT) {
      uVar6 = mp_decode_uint(&mp_num_pos1);
      if (uVar6 != val) {
        pcVar8 = "mp_decode_uint(&mp_num_pos1) == (uint64_t)num1";
        uVar9 = 0x72a;
        goto LAB_00124bf2;
      }
    }
    else if (mVar2 == MP_FLOAT) {
      fVar11 = mp_decode_float(&mp_num_pos1);
      if ((fVar11 != local_254) || (NAN(fVar11) || NAN(local_254))) {
        pcVar8 = "mp_decode_float(&mp_num_pos1) == (float)num1";
        uVar9 = 0x72d;
        goto LAB_00124bf2;
      }
    }
    else if (mVar2 == MP_INT) {
      uVar6 = mp_decode_int(&mp_num_pos1);
      if (uVar6 != val) {
        pcVar8 = "mp_decode_int(&mp_num_pos1) == (int64_t)num1";
        uVar9 = 0x727;
        goto LAB_00124bf2;
      }
    }
    else {
      dVar12 = mp_decode_double(&mp_num_pos1);
      if ((dVar12 != local_240) || (NAN(dVar12) || NAN(local_240))) {
        pcVar8 = "mp_decode_double(&mp_num_pos1) == (double)num1";
        uVar9 = 0x730;
        goto LAB_00124bf2;
      }
    }
    num2 = 0;
    mp_num_pos2 = pcVar8;
    iVar4 = mp_read_int64(&mp_num_pos2,&num2);
    _ok((uint)(iVar4 == 0),"rc == 0",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73b,"check success for code 0x%02X",(ulong)(uint)(int)(char)bVar1);
    _ok((uint)(mp_num_pos1 == mp_num_pos2),"mp_num_pos1 == mp_num_pos2",
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        0x73c,"check position");
    if (num1 < 0) {
      if (-1 < num2) {
        pcVar8 = "num2 < 0";
        uVar9 = 0x745;
        goto LAB_00124bf2;
      }
      pcVar8 = "(int64_t)num1 == (int64_t)num2";
      iVar4 = 0x746;
    }
    else {
      if (num2 < 0) {
        pcVar8 = "num2 >= 0";
        uVar9 = 0x742;
LAB_00124bf2:
        fprintf(_stderr,"Test failed: %s is %s at %s:%d, in function \'%s\'\n",pcVar8,"false",
                "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc"
                ,uVar9,"test_read_num");
        exit(-1);
      }
      pcVar8 = "(uint64_t)num1 == (uint64_t)num2";
      iVar4 = 0x743;
    }
    _ok((uint)(num2 == val),pcVar8,
        "/workspace/llm4binary/github/license_c_cmakelists/tarantool[P]msgpuck/test/msgpuck.cc",
        iVar4,"check int number");
    lVar10 = lVar10 + 0x10;
  } while( true );
}

Assistant:

static void
test_read_num(ValueT num1, ReadF read_f, bool is_ok)
{
	/*
	 * Build the header message.
	 */
	const int str_cap = 256;
	char str[str_cap];
	char *end = str + str_cap;
	char *pos = str + snprintf(str, str_cap, "typed read of ");
	if (std::is_same<ValueT, float>::value)
		pos += snprintf(pos, end - pos, "%f", (float)num1);
	else if (std::is_same<ValueT, double>::value)
		pos += snprintf(pos, end - pos, "%lf", (double)num1);
	else if (num1 >= 0)
		pos += snprintf(pos, end - pos, "%llu", (long long)num1);
	else
		pos += snprintf(pos, end - pos, "%lld", (long long)num1);
	pos += snprintf(pos, end - pos, " into ");

	static_assert(!std::is_same<TargetT, float>::value,
		      "no float reading");
	if (std::is_integral<TargetT>::value) {
		pos += snprintf(pos, end - pos, "int%zu_t",
				sizeof(TargetT) * 8);
	} else {
		pos += snprintf(pos, end - pos, "double");
	}
	note("%s", str);
	/*
	 * Perform the actual tests.
	 */
	char mp_nums[MP_NUMBER_CODEC_COUNT][MP_NUMBER_MAX_LEN];
	int count = 0;
	if (std::is_integral<ValueT>::value) {
		if (num1 >= 0) {
			count += test_encode_uint_all_sizes(
				&mp_nums[count], num1);
		}
		if (num1 <= INT64_MAX) {
			count += test_encode_int_all_sizes(
				&mp_nums[count], num1);
		}
	} else if (!std::is_integral<TargetT>::value || !is_ok) {
		/*
		 * Only encode floating point types when
		 * 1) expect to also decode them back successfully.
		 * 2) want to fail to decode an integer.
		 *
		 * Encoding integers as floats for decoding them back into
		 * integers won't work.
		 */
		if (std::is_same<ValueT, float>::value)
			mp_encode_float(mp_nums[count++], (float)num1);
		mp_encode_double(mp_nums[count++], (double)num1);
	}
	for (int i = 0; i < count; ++i) {
		const char *mp_num_pos1 = mp_nums[i];
		char code = *mp_num_pos1;
		/* Sanity check of the test encoding. */
		if (mp_typeof(*mp_num_pos1) == MP_INT) {
			fail_unless(mp_decode_int(&mp_num_pos1) ==
				    (int64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_UINT) {
			fail_unless(mp_decode_uint(&mp_num_pos1) ==
				    (uint64_t)num1);
		} else if (mp_typeof(*mp_num_pos1) == MP_FLOAT) {
			fail_unless(mp_decode_float(&mp_num_pos1) ==
				    (float)num1);
		} else {
			fail_unless(mp_decode_double(&mp_num_pos1) ==
				    (double)num1);
		}

		const char *mp_num_pos2 = mp_nums[i];
		TargetT num2 = 0;
		int rc = read_f(&mp_num_pos2, &num2);
		if (!is_ok) {
			is(rc, -1, "check failure for code 0x%02X", code);
			is(mp_num_pos2, mp_nums[i], "check position");
			continue;
		}
		is(rc, 0, "check success for code 0x%02X", code);
		is(mp_num_pos1, mp_num_pos2, "check position");
		if (!std::is_integral<TargetT>::value) {
			ok(double_eq(num1, num2), "check float number");
			continue;
		}
		if (num1 >= 0) {
			fail_unless(num2 >= 0);
			is((uint64_t)num1, (uint64_t)num2, "check int number");
		} else {
			fail_unless(num2 < 0);
			is((int64_t)num1, (int64_t)num2, "check int number");
		}
	}
}